

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O0

void svc_xprt_dump_xprts(char *tag)

{
  rbtree_x_part *prVar1;
  int iVar2;
  int rc_1;
  int rc;
  int p_ix;
  rpc_dplx_rec *rec;
  opr_rbtree_node *n;
  rbtree_x_part *t;
  char *tag_local;
  
  if (initialized) {
    for (rc_1 = 0; prVar1 = svc_xprt_fd.xt.tree, rc_1 < 0xc1; rc_1 = rc_1 + 1) {
      iVar2 = pthread_rwlock_rdlock((pthread_rwlock_t *)&svc_xprt_fd.xt.tree[rc_1].lock);
      if (iVar2 != 0) {
        abort();
      }
      if ((__ntirpc_pkg_params.debug_flags & 0x200000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("xprts at %s: tree %d size %d",tag,(ulong)(uint)rc_1);
      }
      for (rec = (rpc_dplx_rec *)opr_rbtree_first(&prVar1[rc_1].t); rec != (rpc_dplx_rec *)0x0;
          rec = (rpc_dplx_rec *)opr_rbtree_next((opr_rbtree_node *)rec)) {
        if ((__ntirpc_pkg_params.debug_flags & 0x200000) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("xprts at %s: %p xp_fd %d",tag,rec[-1].xprt.xp_local.ss.__ss_padding + 0x6e);
        }
      }
      iVar2 = pthread_rwlock_unlock((pthread_rwlock_t *)&prVar1[rc_1].lock);
      if (iVar2 != 0) {
        abort();
      }
    }
  }
  return;
}

Assistant:

void
svc_xprt_dump_xprts(const char *tag)
{
	struct rbtree_x_part *t = NULL;
	struct opr_rbtree_node *n;
	struct rpc_dplx_rec *rec;
	int p_ix;

	if (!initialized)
		goto out;

	p_ix = 0;
	while (p_ix < SVC_XPRT_PARTITIONS) {
		t = &svc_xprt_fd.xt.tree[p_ix];
		rwlock_rdlock(&t->lock);	/* t RLOCKED */
		__warnx(TIRPC_DEBUG_FLAG_SVC_XPRT,
			"xprts at %s: tree %d size %d", tag, p_ix, t->t.size);
		n = opr_rbtree_first(&t->t);
		while (n != NULL) {
			rec = opr_containerof(n, struct rpc_dplx_rec, fd_node);
			__warnx(TIRPC_DEBUG_FLAG_SVC_XPRT,
				"xprts at %s: %p xp_fd %d",
				tag, &rec->xprt, rec->xprt.xp_fd);
			n = opr_rbtree_next(n);
		}		/* curr partition */
		rwlock_unlock(&t->lock);	/* t !LOCKED */
		p_ix++;
	}			/* SVC_XPRT_PARTITIONS */
 out:
	return;
}